

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afloader.c
# Opt level: O0

FT_Error af_loader_load_glyph
                   (AF_Loader loader,AF_Module module,FT_Face face,FT_UInt glyph_index,
                   FT_Int32 load_flags)

{
  FT_Size pFVar1;
  FT_Size_Internal pFVar2;
  FT_GlyphSlot_conflict pFVar3;
  FT_Slot_Internal pFVar4;
  FT_GlyphLoader pFVar5;
  long lVar6;
  long lVar7;
  FT_Bool FVar8;
  FT_Error FVar9;
  FT_Int32 FVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  FT_Render_Mode FVar14;
  undefined1 local_168 [8];
  FT_Vector vvector;
  FT_BBox bbox;
  FT_Pos pp2x_1;
  FT_Pos pp1x_1;
  FT_Pos pp2x;
  FT_Pos pp1x;
  AF_Edge_conflict edge2;
  AF_Edge_conflict edge1;
  AF_AxisHints axis;
  FT_Pos pp2x_uh;
  FT_Pos pp1x_uh;
  FT_Pos new_lsb;
  FT_Pos old_lsb;
  FT_Pos old_rsb;
  FT_Matrix inverse;
  AF_WritingSystemClass writing_system_class;
  AF_StyleClass style_class;
  AF_StyleMetrics_conflict pAStack_a0;
  FT_UInt style_options;
  AF_StyleMetrics_conflict style_metrics;
  AF_ScalerRec scaler;
  AF_GlyphHints hints;
  FT_GlyphLoader gloader;
  FT_Slot_Internal slot_internal;
  FT_GlyphSlot_conflict slot;
  FT_Size_Internal size_internal;
  FT_Size size;
  FT_Error error;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  FT_Face face_local;
  AF_Module module_local;
  AF_Loader loader_local;
  
  pFVar1 = face->size;
  pFVar2 = pFVar1->internal;
  pFVar3 = face->glyph;
  pFVar4 = pFVar3->internal;
  pFVar5 = pFVar4->loader;
  scaler._40_8_ = loader->hints;
  if (pFVar1 == (FT_Size)0x0) {
    loader_local._4_4_ = 0x24;
  }
  else {
    memset(&style_metrics,0,0x30);
    FVar14 = load_flags >> 0x10;
    if (((pFVar2->autohint_metrics).x_scale == 0) || (pFVar2->autohint_mode != (FVar14 & 0xf))) {
      pFVar2->autohint_mode = FVar14 & 0xf;
      memcpy(&pFVar2->autohint_metrics,&pFVar1->metrics,0x38);
    }
    scaler.face = (FT_Face)(pFVar2->autohint_metrics).x_scale;
    scaler.y_scale = 0;
    scaler.x_scale = (pFVar2->autohint_metrics).y_scale;
    scaler.x_delta = 0;
    scaler.y_delta._0_4_ = FVar14 & 0xf;
    scaler.y_delta._4_4_ = 0;
    style_metrics = (AF_StyleMetrics_conflict)face;
    size._4_4_ = af_loader_reset(loader,module,face);
    if ((size._4_4_ == 0) &&
       (size._4_4_ = af_face_globals_get_metrics
                               (loader->globals,glyph_index,0x40,&stack0xffffffffffffff60),
       size._4_4_ == 0)) {
      inverse.yy = (FT_Fixed)af_writing_system_classes[pAStack_a0->style_class->writing_system];
      loader->metrics = pAStack_a0;
      if (((AF_WritingSystemClass)inverse.yy)->style_metrics_scale ==
          (AF_WritingSystem_ScaleMetricsFunc)0x0) {
        memcpy(&pAStack_a0->scaler,&style_metrics,0x30);
      }
      else {
        (*((AF_WritingSystemClass)inverse.yy)->style_metrics_scale)
                  (pAStack_a0,(AF_Scaler)&style_metrics);
      }
      if (((*(long *)(inverse.yy + 0x30) == 0) ||
          (size._4_4_ = (**(code **)(inverse.yy + 0x30))(scaler._40_8_,pAStack_a0), size._4_4_ == 0)
          ) && (size._4_4_ = FT_Load_Glyph(face,glyph_index,load_flags & 0xfffffffbU | 0x2801),
               size._4_4_ == 0)) {
        if (((FT_Render_Mode)scaler.y_delta == FT_RENDER_MODE_LIGHT) &&
           ((face->internal->no_stem_darkening == '\0' ||
            ((face->internal->no_stem_darkening < '\0' && (module->no_stem_darkening == '\0')))))) {
          af_loader_embolden_glyph_in_slot(loader,face,pAStack_a0);
        }
        loader->transformed = pFVar4->glyph_transformed;
        if (loader->transformed != '\0') {
          (loader->trans_matrix).xx = (pFVar4->glyph_matrix).xx;
          (loader->trans_matrix).xy = (pFVar4->glyph_matrix).xy;
          (loader->trans_matrix).yx = (pFVar4->glyph_matrix).yx;
          (loader->trans_matrix).yy = (pFVar4->glyph_matrix).yy;
          (loader->trans_delta).x = (pFVar4->glyph_delta).x;
          (loader->trans_delta).y = (pFVar4->glyph_delta).y;
          old_rsb = (loader->trans_matrix).xx;
          inverse.xx = (loader->trans_matrix).xy;
          inverse.xy = (loader->trans_matrix).yx;
          inverse.yx = (loader->trans_matrix).yy;
          FVar9 = FT_Matrix_Invert((FT_Matrix *)&old_rsb);
          if (FVar9 == 0) {
            FT_Vector_Transform(&loader->trans_delta,(FT_Matrix *)&old_rsb);
          }
        }
        if (pFVar3->format == FT_GLYPH_FORMAT_OUTLINE) {
          if (loader->transformed != '\0') {
            FT_Outline_Translate(&pFVar3->outline,(loader->trans_delta).x,(loader->trans_delta).y);
          }
          (loader->pp1).x = *(FT_Pos *)(scaler._40_8_ + 0x10);
          (loader->pp1).y = *(FT_Pos *)(scaler._40_8_ + 0x20);
          FVar10 = FT_MulFix_x86_64((FT_Int32)(pFVar3->metrics).horiAdvance,
                                    (FT_Int32)*(undefined8 *)(scaler._40_8_ + 8));
          (loader->pp2).x = (long)FVar10 + *(long *)(scaler._40_8_ + 0x10);
          (loader->pp2).y = *(FT_Pos *)(scaler._40_8_ + 0x20);
          if ((pFVar3->outline).n_points != 0) {
            if (*(long *)(inverse.yy + 0x38) != 0) {
              (**(code **)(inverse.yy + 0x38))(glyph_index,scaler._40_8_,&pFVar5->base,pAStack_a0);
            }
            if ((FT_Render_Mode)scaler.y_delta == FT_RENDER_MODE_LIGHT) {
              lVar6 = (loader->pp1).x;
              lVar11 = (loader->pp2).x;
              (loader->pp1).x = lVar6 + 0x20U & 0xffffffffffffffc0;
              (loader->pp2).x = lVar11 + 0x20U & 0xffffffffffffffc0;
              pFVar3->lsb_delta = (loader->pp1).x - lVar6;
              pFVar3->rsb_delta = (loader->pp2).x - lVar11;
            }
            else {
              lVar6 = *(long *)(scaler._40_8_ + 0x60);
              lVar11 = lVar6 + (long)*(int *)(scaler._40_8_ + 0x58) * 0x58;
              if ((*(int *)(scaler._40_8_ + 0x58) < 2) ||
                 ((*(uint *)(scaler._40_8_ + 0x1418) & 4) != 0)) {
                lVar6 = (loader->pp1).x;
                lVar11 = (loader->pp2).x;
                (loader->pp1).x =
                     lVar6 + *(long *)(scaler._40_8_ + 0x1428) + 0x20U & 0xffffffffffffffc0;
                (loader->pp2).x =
                     lVar11 + *(long *)(scaler._40_8_ + 0x1430) + 0x20U & 0xffffffffffffffc0;
                pFVar3->lsb_delta = (loader->pp1).x - lVar6;
                pFVar3->rsb_delta = (loader->pp2).x - lVar11;
              }
              else {
                lVar12 = (loader->pp2).x - *(long *)(lVar11 + -0x50);
                lVar7 = *(long *)(lVar6 + 8);
                lVar6 = *(long *)(lVar6 + 0x10);
                pp2x_uh = lVar6 - lVar7;
                axis = (AF_AxisHints)(*(long *)(lVar11 + -0x48) + lVar12);
                if (lVar7 < 0x18) {
                  pp2x_uh = pp2x_uh + -8;
                }
                if (lVar12 < 0x18) {
                  axis = (AF_AxisHints)&axis->segments;
                }
                (loader->pp1).x = pp2x_uh + 0x20U & 0xffffffffffffffc0;
                (loader->pp2).x = (ulong)&axis->major_dir & 0xffffffffffffffc0;
                if ((lVar6 <= (loader->pp1).x) && (0 < lVar7)) {
                  (loader->pp1).x = (loader->pp1).x + -0x40;
                }
                if (((loader->pp2).x <= *(long *)(lVar11 + -0x48)) && (0 < lVar12)) {
                  (loader->pp2).x = (loader->pp2).x + 0x40;
                }
                pFVar3->lsb_delta = (loader->pp1).x - pp2x_uh;
                pFVar3->rsb_delta = (loader->pp2).x - (long)axis;
              }
            }
          }
        }
        else {
          size._4_4_ = 7;
        }
        local_168 = (undefined1  [8])
                    ((pFVar3->metrics).vertBearingX - (pFVar3->metrics).horiBearingX);
        vvector.x = (pFVar3->metrics).vertBearingY - (pFVar3->metrics).horiBearingY;
        FVar10 = FT_MulFix_x86_64(SUB84(local_168,0),(FT_Int32)(pAStack_a0->scaler).x_scale);
        local_168 = (undefined1  [8])(long)FVar10;
        FVar10 = FT_MulFix_x86_64((FT_Int32)vvector.x,(FT_Int32)(pAStack_a0->scaler).y_scale);
        vvector.x = (FT_Pos)FVar10;
        if (loader->transformed != '\0') {
          FT_Outline_Transform(&(pFVar5->base).outline,&loader->trans_matrix);
          FT_Vector_Transform((FT_Vector *)local_168,&loader->trans_matrix);
        }
        if ((loader->pp1).x != 0) {
          FT_Outline_Translate(&(pFVar5->base).outline,-(loader->pp1).x,0);
        }
        FT_Outline_Get_CBox(&(pFVar5->base).outline,(FT_BBox *)&vvector.y);
        vvector.y = vvector.y & 0xffffffffffffffc0;
        uVar13 = bbox.xMax + 0x3fU & 0xffffffffffffffc0;
        (pFVar3->metrics).width = (bbox.yMin + 0x3fU & 0xffffffffffffffc0) - vvector.y;
        (pFVar3->metrics).height = uVar13 - (bbox.xMin & 0xffffffffffffffc0U);
        (pFVar3->metrics).horiBearingX = vvector.y;
        (pFVar3->metrics).horiBearingY = uVar13;
        (pFVar3->metrics).vertBearingX = vvector.y + (long)local_168 & 0xffffffffffffffc0;
        (pFVar3->metrics).vertBearingY = uVar13 + vvector.x & 0xffffffffffffffc0;
        if (((FT_Render_Mode)scaler.y_delta == FT_RENDER_MODE_LIGHT) ||
           (((pFVar3->face->face_flags & 4U) == 0 &&
            ((FVar8 = af_face_globals_is_digit(loader->globals,glyph_index), FVar8 == '\0' ||
             (pAStack_a0->digits_have_same_width == '\0')))))) {
          if ((pFVar3->metrics).horiAdvance != 0) {
            (pFVar3->metrics).horiAdvance = (loader->pp2).x - (loader->pp1).x;
          }
        }
        else {
          FVar10 = FT_MulFix_x86_64((FT_Int32)(pFVar3->metrics).horiAdvance,
                                    (FT_Int32)(pAStack_a0->scaler).x_scale);
          (pFVar3->metrics).horiAdvance = (long)FVar10;
          pFVar3->lsb_delta = 0;
          pFVar3->rsb_delta = 0;
        }
        FVar10 = FT_MulFix_x86_64((FT_Int32)(pFVar3->metrics).vertAdvance,
                                  (FT_Int32)(pAStack_a0->scaler).y_scale);
        (pFVar3->metrics).vertAdvance = (long)FVar10;
        (pFVar3->metrics).horiAdvance = (pFVar3->metrics).horiAdvance + 0x20U & 0xffffffffffffffc0;
        (pFVar3->metrics).vertAdvance = (pFVar3->metrics).vertAdvance + 0x20U & 0xffffffffffffffc0;
        pFVar3->format = FT_GLYPH_FORMAT_OUTLINE;
      }
    }
    loader_local._4_4_ = size._4_4_;
  }
  return loader_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_loader_load_glyph( AF_Loader  loader,
                        AF_Module  module,
                        FT_Face    face,
                        FT_UInt    glyph_index,
                        FT_Int32   load_flags )
  {
    FT_Error  error;

    FT_Size           size          = face->size;
    FT_Size_Internal  size_internal = size->internal;
    FT_GlyphSlot      slot          = face->glyph;
    FT_Slot_Internal  slot_internal = slot->internal;
    FT_GlyphLoader    gloader       = slot_internal->loader;

    AF_GlyphHints          hints         = loader->hints;
    AF_ScalerRec           scaler;
    AF_StyleMetrics        style_metrics;
    FT_UInt                style_options = AF_STYLE_NONE_DFLT;
    AF_StyleClass          style_class;
    AF_WritingSystemClass  writing_system_class;

#ifdef FT_CONFIG_OPTION_PIC
    AF_FaceGlobals  globals = loader->globals;
#endif


    if ( !size )
      return FT_THROW( Invalid_Size_Handle );

    FT_ZERO( &scaler );

    if ( !size_internal->autohint_metrics.x_scale                          ||
         size_internal->autohint_mode != FT_LOAD_TARGET_MODE( load_flags ) )
    {
      /* switching between hinting modes usually means different scaling */
      /* values; this later on enforces recomputation of everything      */
      /* related to the current size                                     */

      size_internal->autohint_mode    = FT_LOAD_TARGET_MODE( load_flags );
      size_internal->autohint_metrics = size->metrics;

#ifdef AF_CONFIG_OPTION_TT_SIZE_METRICS
      {
        FT_Size_Metrics*  size_metrics = &size_internal->autohint_metrics;


        /* set metrics to integer values and adjust scaling accordingly; */
        /* this is the same setup as with TrueType fonts, cf. function   */
        /* `tt_size_reset' in file `ttobjs.c'                            */
        size_metrics->ascender  = FT_PIX_ROUND(
                                    FT_MulFix( face->ascender,
                                               size_metrics->y_scale ) );
        size_metrics->descender = FT_PIX_ROUND(
                                    FT_MulFix( face->descender,
                                               size_metrics->y_scale ) );
        size_metrics->height    = FT_PIX_ROUND(
                                    FT_MulFix( face->height,
                                               size_metrics->y_scale ) );

        size_metrics->x_scale     = FT_DivFix( size_metrics->x_ppem << 6,
                                               face->units_per_EM );
        size_metrics->y_scale     = FT_DivFix( size_metrics->y_ppem << 6,
                                               face->units_per_EM );
        size_metrics->max_advance = FT_PIX_ROUND(
                                      FT_MulFix( face->max_advance_width,
                                                 size_metrics->x_scale ) );
      }
#endif /* AF_CONFIG_OPTION_TT_SIZE_METRICS */
    }

    /*
     *  TODO: This code currently doesn't support fractional advance widths,
     *  i.e., placing hinted glyphs at anything other than integer
     *  x-positions.  This is only relevant for the warper code, which
     *  scales and shifts glyphs to optimize blackness of stems (hinting on
     *  the x-axis by nature places things on pixel integers, hinting on the
     *  y-axis only, i.e., LIGHT mode, doesn't touch the x-axis).  The delta
     *  values of the scaler would need to be adjusted.
     */
    scaler.face    = face;
    scaler.x_scale = size_internal->autohint_metrics.x_scale;
    scaler.x_delta = 0;
    scaler.y_scale = size_internal->autohint_metrics.y_scale;
    scaler.y_delta = 0;

    scaler.render_mode = FT_LOAD_TARGET_MODE( load_flags );
    scaler.flags       = 0;

    /* note that the fallback style can't be changed anymore */
    /* after the first call of `af_loader_load_glyph'        */
    error = af_loader_reset( loader, module, face );
    if ( error )
      goto Exit;

#ifdef FT_OPTION_AUTOFIT2
    /* XXX: undocumented hook to activate the latin2 writing system. */
    if ( load_flags & ( 1UL << 20 ) )
      style_options = AF_STYLE_LTN2_DFLT;
#endif

    /*
     *  Glyphs (really code points) are assigned to scripts.  Script
     *  analysis is done lazily: For each glyph that passes through here,
     *  the corresponding script analyzer is called, but returns immediately
     *  if it has been run already.
     */
    error = af_face_globals_get_metrics( loader->globals, glyph_index,
                                         style_options, &style_metrics );
    if ( error )
      goto Exit;

    style_class          = style_metrics->style_class;
    writing_system_class =
      AF_WRITING_SYSTEM_CLASSES_GET[style_class->writing_system];

    loader->metrics = style_metrics;

    if ( writing_system_class->style_metrics_scale )
      writing_system_class->style_metrics_scale( style_metrics, &scaler );
    else
      style_metrics->scaler = scaler;

    if ( writing_system_class->style_hints_init )
    {
      error = writing_system_class->style_hints_init( hints,
                                                      style_metrics );
      if ( error )
        goto Exit;
    }

    /*
     *  Do the main work of `af_loader_load_glyph'.  Note that we never have
     *  to deal with composite glyphs as those get loaded into
     *  FT_GLYPH_FORMAT_OUTLINE by the recursed `FT_Load_Glyph' function.
     *  In the rare cases where FT_LOAD_NO_RECURSE is set, it implies
     *  FT_LOAD_NO_SCALE and as such the auto-hinter is never called.
     */
    load_flags |=  FT_LOAD_NO_SCALE         |
                   FT_LOAD_IGNORE_TRANSFORM |
                   FT_LOAD_LINEAR_DESIGN;
    load_flags &= ~FT_LOAD_RENDER;

    error = FT_Load_Glyph( face, glyph_index, load_flags );
    if ( error )
      goto Exit;

    /*
     *  Apply stem darkening (emboldening) here before hints are applied to
     *  the outline.  Glyphs are scaled down proportionally to the
     *  emboldening so that curve points don't fall outside their
     *  precomputed blue zones.
     *
     *  Any emboldening done by the font driver (e.g., the CFF driver)
     *  doesn't reach here because the autohinter loads the unprocessed
     *  glyphs in font units for analysis (functions `af_*_metrics_init_*')
     *  and then above to prepare it for the rasterizers by itself,
     *  independently of the font driver.  So emboldening must be done here,
     *  within the autohinter.
     *
     *  All glyphs to be autohinted pass through here one by one.  The
     *  standard widths can therefore change from one glyph to the next,
     *  depending on what script a glyph is assigned to (each script has its
     *  own set of standard widths and other metrics).  The darkening amount
     *  must therefore be recomputed for each size and
     *  `standard_{vertical,horizontal}_width' change.
     *
     *  Ignore errors and carry on without emboldening.
     *
     */

    /* stem darkening only works well in `light' mode */
    if ( scaler.render_mode == FT_RENDER_MODE_LIGHT    &&
         ( !face->internal->no_stem_darkening        ||
           ( face->internal->no_stem_darkening < 0 &&
             !module->no_stem_darkening            ) ) )
      af_loader_embolden_glyph_in_slot( loader, face, style_metrics );

    loader->transformed = slot_internal->glyph_transformed;
    if ( loader->transformed )
    {
      FT_Matrix  inverse;


      loader->trans_matrix = slot_internal->glyph_matrix;
      loader->trans_delta  = slot_internal->glyph_delta;

      inverse = loader->trans_matrix;
      if ( !FT_Matrix_Invert( &inverse ) )
        FT_Vector_Transform( &loader->trans_delta, &inverse );
    }

    switch ( slot->format )
    {
    case FT_GLYPH_FORMAT_OUTLINE:
      /* translate the loaded glyph when an internal transform is needed */
      if ( loader->transformed )
        FT_Outline_Translate( &slot->outline,
                              loader->trans_delta.x,
                              loader->trans_delta.y );

      /* compute original horizontal phantom points */
      /* (and ignore vertical ones)                 */
      loader->pp1.x = hints->x_delta;
      loader->pp1.y = hints->y_delta;
      loader->pp2.x = FT_MulFix( slot->metrics.horiAdvance,
                                 hints->x_scale ) + hints->x_delta;
      loader->pp2.y = hints->y_delta;

      /* be sure to check for spacing glyphs */
      if ( slot->outline.n_points == 0 )
        goto Hint_Metrics;

      /* now load the slot image into the auto-outline */
      /* and run the automatic hinting process         */
      if ( writing_system_class->style_hints_apply )
        writing_system_class->style_hints_apply( glyph_index,
                                                 hints,
                                                 &gloader->base.outline,
                                                 style_metrics );

      /* we now need to adjust the metrics according to the change in */
      /* width/positioning that occurred during the hinting process   */
      if ( scaler.render_mode != FT_RENDER_MODE_LIGHT )
      {
        FT_Pos  old_rsb, old_lsb, new_lsb;
        FT_Pos  pp1x_uh, pp2x_uh;

        AF_AxisHints  axis  = &hints->axis[AF_DIMENSION_HORZ];
        AF_Edge       edge1 = axis->edges;         /* leftmost edge  */
        AF_Edge       edge2 = edge1 +
                              axis->num_edges - 1; /* rightmost edge */


        if ( axis->num_edges > 1 && AF_HINTS_DO_ADVANCE( hints ) )
        {
          old_rsb = loader->pp2.x - edge2->opos;
          /* loader->pp1.x is always zero at this point of time */
          old_lsb = edge1->opos /* - loader->pp1.x */;
          new_lsb = edge1->pos;

          /* remember unhinted values to later account */
          /* for rounding errors                       */
          pp1x_uh = new_lsb    - old_lsb;
          pp2x_uh = edge2->pos + old_rsb;

          /* prefer too much space over too little space */
          /* for very small sizes                        */

          if ( old_lsb < 24 )
            pp1x_uh -= 8;

          if ( old_rsb < 24 )
            pp2x_uh += 8;

          loader->pp1.x = FT_PIX_ROUND( pp1x_uh );
          loader->pp2.x = FT_PIX_ROUND( pp2x_uh );

          if ( loader->pp1.x >= new_lsb && old_lsb > 0 )
            loader->pp1.x -= 64;

          if ( loader->pp2.x <= edge2->pos && old_rsb > 0 )
            loader->pp2.x += 64;

          slot->lsb_delta = loader->pp1.x - pp1x_uh;
          slot->rsb_delta = loader->pp2.x - pp2x_uh;
        }
        else
        {
          FT_Pos  pp1x = loader->pp1.x;
          FT_Pos  pp2x = loader->pp2.x;


          loader->pp1.x = FT_PIX_ROUND( pp1x + hints->xmin_delta );
          loader->pp2.x = FT_PIX_ROUND( pp2x + hints->xmax_delta );

          slot->lsb_delta = loader->pp1.x - pp1x;
          slot->rsb_delta = loader->pp2.x - pp2x;
        }
      }
      /* `light' mode uses integer advance widths */
      /* but sets `lsb_delta' and `rsb_delta'     */
      else
      {
        FT_Pos  pp1x = loader->pp1.x;
        FT_Pos  pp2x = loader->pp2.x;


        loader->pp1.x = FT_PIX_ROUND( pp1x );
        loader->pp2.x = FT_PIX_ROUND( pp2x );

        slot->lsb_delta = loader->pp1.x - pp1x;
        slot->rsb_delta = loader->pp2.x - pp2x;
      }

      break;

    default:
      /* we don't support other formats (yet?) */
      error = FT_THROW( Unimplemented_Feature );
    }

  Hint_Metrics:
    {
      FT_BBox    bbox;
      FT_Vector  vvector;


      vvector.x = slot->metrics.vertBearingX - slot->metrics.horiBearingX;
      vvector.y = slot->metrics.vertBearingY - slot->metrics.horiBearingY;
      vvector.x = FT_MulFix( vvector.x, style_metrics->scaler.x_scale );
      vvector.y = FT_MulFix( vvector.y, style_metrics->scaler.y_scale );

      /* transform the hinted outline if needed */
      if ( loader->transformed )
      {
        FT_Outline_Transform( &gloader->base.outline, &loader->trans_matrix );
        FT_Vector_Transform( &vvector, &loader->trans_matrix );
      }

      /* we must translate our final outline by -pp1.x and compute */
      /* the new metrics                                           */
      if ( loader->pp1.x )
        FT_Outline_Translate( &gloader->base.outline, -loader->pp1.x, 0 );

      FT_Outline_Get_CBox( &gloader->base.outline, &bbox );

      bbox.xMin = FT_PIX_FLOOR( bbox.xMin );
      bbox.yMin = FT_PIX_FLOOR( bbox.yMin );
      bbox.xMax = FT_PIX_CEIL(  bbox.xMax );
      bbox.yMax = FT_PIX_CEIL(  bbox.yMax );

      slot->metrics.width        = bbox.xMax - bbox.xMin;
      slot->metrics.height       = bbox.yMax - bbox.yMin;
      slot->metrics.horiBearingX = bbox.xMin;
      slot->metrics.horiBearingY = bbox.yMax;

      slot->metrics.vertBearingX = FT_PIX_FLOOR( bbox.xMin + vvector.x );
      slot->metrics.vertBearingY = FT_PIX_FLOOR( bbox.yMax + vvector.y );

      /* for mono-width fonts (like Andale, Courier, etc.) we need */
      /* to keep the original rounded advance width; ditto for     */
      /* digits if all have the same advance width                 */
      if ( scaler.render_mode != FT_RENDER_MODE_LIGHT                       &&
           ( FT_IS_FIXED_WIDTH( slot->face )                              ||
             ( af_face_globals_is_digit( loader->globals, glyph_index ) &&
               style_metrics->digits_have_same_width                    ) ) )
      {
        slot->metrics.horiAdvance =
          FT_MulFix( slot->metrics.horiAdvance,
                     style_metrics->scaler.x_scale );

        /* Set delta values to 0.  Otherwise code that uses them is */
        /* going to ruin the fixed advance width.                   */
        slot->lsb_delta = 0;
        slot->rsb_delta = 0;
      }
      else
      {
        /* non-spacing glyphs must stay as-is */
        if ( slot->metrics.horiAdvance )
          slot->metrics.horiAdvance = loader->pp2.x - loader->pp1.x;
      }

      slot->metrics.vertAdvance = FT_MulFix( slot->metrics.vertAdvance,
                                             style_metrics->scaler.y_scale );

      slot->metrics.horiAdvance = FT_PIX_ROUND( slot->metrics.horiAdvance );
      slot->metrics.vertAdvance = FT_PIX_ROUND( slot->metrics.vertAdvance );

      slot->format  = FT_GLYPH_FORMAT_OUTLINE;
    }

  Exit:
    return error;
  }